

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall hwnet::Buffer::Append(Buffer *this,char *ptr,size_t l)

{
  char *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined1 local_40 [8];
  Ptr newbuff;
  size_t cap_;
  size_t need;
  size_t l_local;
  char *ptr_local;
  Buffer *this_local;
  
  if (((ptr != (char *)0x0) && (l != 0)) &&
     (p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->len + l),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->len <= p_Var1)) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->cap < p_Var1) {
      newbuff.super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var1;
      std::make_shared<hwnet::Buffer::bytes,unsigned_long&>((unsigned_long *)local_40);
      peVar2 = std::
               __shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      __dest = peVar2->ptr;
      peVar2 = std::
               __shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      memcpy(__dest,peVar2->ptr + this->b,this->len);
      this->cap = (size_t)newbuff.
                          super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
      std::shared_ptr<hwnet::Buffer::bytes>::operator=
                (&this->buff,(shared_ptr<hwnet::Buffer::bytes> *)local_40);
      this->b = 0;
      std::shared_ptr<hwnet::Buffer::bytes>::~shared_ptr
                ((shared_ptr<hwnet::Buffer::bytes> *)local_40);
    }
    peVar2 = std::
             __shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    memcpy(peVar2->ptr + this->b + this->len,ptr,l);
    this->len = l + this->len;
  }
  return;
}

Assistant:

void Append(const char *ptr,size_t l) {
		if(ptr && l > 0) {
			auto need = this->len + l;
			if(need < this->len) {
				//overflow
				return;
			}

			if(need > this->cap) {
				//扩容
				size_t cap_ = need;
				bytes::Ptr newbuff = std::make_shared<bytes>(cap_);
				memcpy(newbuff->ptr,this->buff->ptr + this->b,this->len);
				this->cap = cap_;
				this->buff = newbuff;
				this->b = 0;
			}
			memcpy(this->buff->ptr + this->len + this->b , ptr , l);
			this->len += l;			
		}
	}